

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbPush.c
# Opt level: O3

void Acb_ObjRemoveConst(Acb_Ntk_t *p,int iObj)

{
  ulong uVar1;
  uint *puVar2;
  uint iObj_00;
  ulong uVar3;
  Vec_Int_t *pVVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  byte bVar8;
  ulong uVar9;
  uint uVar10;
  word *pwVar11;
  char *__assertion;
  long lVar12;
  uint uVar13;
  
  if (iObj < 1) {
    __assertion = "i>0";
  }
  else {
    uVar13 = (p->vObjTruth).nSize;
    if (0 < (int)uVar13) {
      if (uVar13 <= (uint)iObj) {
LAB_003aa6a3:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                      ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
      }
      if ((p->vObjType).nSize <= iObj) {
LAB_003aa63d:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      if (0xfd < (byte)((p->vObjType).pArray[(uint)iObj] - 5U)) {
        __assert_fail("!Acb_ObjIsCio(p, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbPush.c"
                      ,0xcd,"void Acb_ObjRemoveConst(Acb_Ntk_t *, int)");
      }
      if (iObj < (p->vObjFans).nSize) {
        iVar6 = (p->vObjFans).pArray[(uint)iObj];
        if (((long)iVar6 < 0) || ((p->vFanSto).nSize <= iVar6)) {
LAB_003aa67b:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        if ((p->vFanSto).pArray[iVar6] != 0) {
          __assert_fail("Acb_ObjFaninNum(p, iObj) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbPush.c"
                        ,0xce,"void Acb_ObjRemoveConst(Acb_Ntk_t *, int)");
        }
        uVar3 = (p->vObjTruth).pArray[(uint)iObj];
        if (1 < uVar3 + 1) {
          __assert_fail("uTruth == 0 || ~uTruth == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbPush.c"
                        ,0xcf,"void Acb_ObjRemoveConst(Acb_Ntk_t *, int)");
        }
        iVar6 = (p->vFanouts).nSize;
        do {
          if (iVar6 <= iObj) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                          ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
          pVVar4 = (p->vFanouts).pArray;
          uVar13 = pVVar4[(uint)iObj].nSize;
          if ((int)uVar13 < 1) {
LAB_003aa618:
            if (uVar13 == 0) {
              if ((p->vObjType).nSize <= iObj) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                              ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
              }
              (p->vObjType).pArray[(uint)iObj] = '\0';
            }
            return;
          }
          uVar9 = 0;
          while( true ) {
            iObj_00 = pVVar4[(uint)iObj].pArray[uVar9];
            lVar12 = (long)(int)iObj_00;
            if (lVar12 < 1) {
              __assert_fail("i>0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                            ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
            }
            if ((p->vObjType).nSize <= (int)iObj_00) goto LAB_003aa63d;
            uVar10 = (uint)(byte)(p->vObjType).pArray[lVar12];
            if ((4 < uVar10) || ((0x19U >> (uVar10 & 0x1f) & 1) == 0)) break;
            uVar9 = uVar9 + 1;
            if (uVar13 == uVar9) goto LAB_003aa618;
          }
          if ((p->vObjFans).nSize <= (int)iObj_00) break;
          iVar6 = (p->vObjFans).pArray[lVar12];
          if (((long)iVar6 < 0) || ((p->vFanSto).nSize <= iVar6)) goto LAB_003aa67b;
          puVar2 = (uint *)((p->vFanSto).pArray + iVar6);
          uVar13 = *puVar2;
          uVar9 = (ulong)uVar13;
          if ((int)uVar13 < 1) {
            uVar9 = 0;
          }
          uVar7 = 0;
          do {
            if (uVar9 == uVar7) {
              uVar13 = 0xffffffff;
              goto LAB_003aa49f;
            }
            uVar1 = uVar7 + 1;
            lVar5 = uVar7 + 1;
            uVar7 = uVar1;
          } while (puVar2[lVar5] != iObj);
          uVar13 = (int)uVar1 - 1;
LAB_003aa49f:
          uVar10 = (p->vObjTruth).nSize;
          if ((int)uVar10 < 1) goto LAB_003aa69a;
          if (uVar10 <= iObj_00) goto LAB_003aa6a3;
          uVar9 = (p->vObjTruth).pArray[lVar12];
          Acb_ObjRemoveFaninFanoutOne(p,iObj_00,iObj);
          if ((uVar3 & 1) == 0) {
            if (5 < uVar13) {
              __assert_fail("iVar >= 0 && iVar < 6",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                            ,0x337,"word Abc_Tt6Cofactor0(word, int)");
            }
            uVar7 = s_Truths6Neg[uVar13];
            uVar9 = uVar9 & uVar7;
            bVar8 = (byte)(1 << ((byte)uVar13 & 0x1f));
            uVar9 = uVar9 << (bVar8 & 0x3f) | uVar9;
          }
          else {
            if (5 < uVar13) {
              __assert_fail("iVar >= 0 && iVar < 6",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                            ,0x33c,"word Abc_Tt6Cofactor1(word, int)");
            }
            uVar9 = uVar9 & s_Truths6[uVar13];
            bVar8 = (byte)(1 << ((byte)uVar13 & 0x1f));
            uVar9 = uVar9 >> (bVar8 & 0x3f) | uVar9;
            uVar7 = s_Truths6Neg[uVar13];
          }
          if (((uVar9 >> (bVar8 & 0x3f) ^ uVar9) & uVar7) != 0) {
            __assert_fail("!Abc_Tt6HasVar(t, iVar)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                          ,0x6cb,"word Abc_Tt6RemoveVar(word, int)");
          }
          if (uVar13 < 5) {
            pwVar11 = s_PMasks[uVar13] + 2;
            uVar7 = (ulong)uVar13;
            do {
              uVar1 = uVar7 + 1;
              bVar8 = (byte)(1 << ((byte)uVar7 & 0x1f));
              uVar9 = (uVar9 & *pwVar11) >> (bVar8 & 0x3f) |
                      (pwVar11[-1] & uVar9) << (bVar8 & 0x3f) |
                      (*(word (*) [3])(pwVar11 + -2))[0] & uVar9;
              pwVar11 = pwVar11 + 3;
              uVar7 = uVar1;
            } while ((int)uVar1 != 5);
          }
          if ((p->vObjTruth).nSize <= (int)iObj_00) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                          ,0x1cf,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
          }
          (p->vObjTruth).pArray[lVar12] = uVar9;
          do {
            iVar6 = Acb_ObjSuppMin_int(p,iObj_00);
          } while (iVar6 != 0);
          iVar6 = (p->vFanouts).nSize;
        } while( true );
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
LAB_003aa69a:
    __assertion = "Acb_NtkHasObjTruths(p)";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                ,0x10b,"word Acb_ObjTruth(Acb_Ntk_t *, int)");
}

Assistant:

void Acb_ObjRemoveConst( Acb_Ntk_t * p, int iObj )
{
    int iFanout;
    word uTruth = Acb_ObjTruth( p, iObj );
    assert( !Acb_ObjIsCio(p, iObj) );
    assert( Acb_ObjFaninNum(p, iObj) == 0 );
    assert( uTruth == 0 || ~uTruth == 0 );
    while ( (iFanout = Acb_ObjFindNodeFanout(p, iObj)) >= 0 )
    {
        int iObjIndex = Acb_ObjWhatFanin( p, iFanout, iObj );
        word uTruthF = Acb_ObjTruth( p, iFanout );
        Acb_ObjRemoveFaninFanoutOne( p, iFanout, iObj );
        uTruthF = (uTruth & 1) ? Abc_Tt6Cofactor1(uTruthF, iObjIndex) : Abc_Tt6Cofactor0(uTruthF, iObjIndex);
        Vec_WrdWriteEntry( &p->vObjTruth, iFanout, Abc_Tt6RemoveVar(uTruthF, iObjIndex) );
        Acb_ObjSuppMin( p, iFanout );
    }
    if ( Acb_ObjFanoutNum(p, iObj) == 0 )
        Acb_ObjCleanType( p, iObj );
}